

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.h
# Opt level: O2

pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *
anurbs::Line<3L>::closest_point
          (pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *__return_storage_ptr__,Vector *point
          ,Vector *line_a,Vector *line_b,bool is_infinite)

{
  double dVar1;
  double t;
  Vector o;
  Vector v;
  Vector r;
  ResScalar local_120;
  double local_118;
  double dStack_110;
  double local_108;
  double local_f8;
  double dStack_f0;
  double local_e8;
  undefined1 local_e0 [24];
  double local_c8;
  LhsNested local_c0;
  RhsNested pMStack_b8;
  Vector *local_98;
  Vector *local_90;
  PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> local_80 [24];
  type local_68;
  
  local_e0._0_8_ = line_b;
  local_e0._8_8_ = line_a;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_f8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)local_e0);
  local_68._0_8_ = local_e8 * local_e8 + dStack_f0 * dStack_f0 + local_f8 * local_f8;
  if (1e-14 <= (double)local_68._0_8_) {
    local_108 = (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                m_data.array[2];
    local_118 = (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                m_data.array[0];
    dStack_110 = (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array[1];
    local_68._0_8_ = 1.0 / (double)local_68._0_8_;
    Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator*
              ((type *)local_e0,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_f8,
               (double *)&local_68);
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const>>
              (local_80,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                         *)local_e0);
    local_e0._8_8_ = &local_118;
    local_e0._0_8_ = point;
    local_120 = Eigen::internal::
                dot_nocheck<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_false>
                ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                       *)local_e0,(MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_80);
    if (0.0 <= local_120 || is_infinite) {
      if (local_120 <= 1.0 || is_infinite) {
        local_98 = line_b;
        local_90 = line_a;
        Eigen::operator*(&local_68,&local_120,(StorageBaseType *)&local_98);
        local_c8 = local_68.m_lhs.m_functor.m_other;
        local_c0 = local_68.m_rhs.m_lhs;
        pMStack_b8 = local_68.m_rhs.m_rhs;
        local_e0._0_8_ = line_a;
        Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)
                   &__return_storage_ptr__->second,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>
                    *)local_e0);
        __return_storage_ptr__->first = local_120;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->first = 1.0;
      dVar1 = (line_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
              m_data.array[1];
      (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[0] =
           (line_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[0];
      (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[1] = dVar1;
      dVar1 = (line_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
              m_data.array[2];
      goto LAB_0019877e;
    }
  }
  __return_storage_ptr__->first = 0.0;
  dVar1 = (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] =
       (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
       [0];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[1] = dVar1;
  dVar1 = (line_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
LAB_0019877e:
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[2] = dVar1;
  return __return_storage_ptr__;
}

Assistant:

static std::pair<double, Vector> closest_point(const Vector& point, const Vector& line_a, const Vector& line_b, bool is_infinite=false)
    {
        const Vector v = line_b - line_a;
        const double l = v.squaredNorm();

        if (l < 1e-14) {
            return {0.0, line_a};
        }

        const Vector o = line_a;
        const Vector r = v * (1.0 / l);
        const double t = (point - o).dot(r);

        if (!is_infinite && t < 0) {
            return {0.0, line_a};
        }
        
        if (!is_infinite && t > 1) {
            return {1.0, line_b};
        }

        const Vector closest_point = line_a + t * (line_b - line_a);

        return {t, closest_point};
    }